

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendstate.c
# Opt level: O0

int quicly_sendstate_shutdown(quicly_sendstate_t *state,uint64_t final_size)

{
  int iVar1;
  ulong in_RSI;
  quicly_sendstate_t *in_RDI;
  int ret;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = quicly_sendstate_is_open(in_RDI);
  if (iVar1 == 0) {
    __assert_fail("quicly_sendstate_is_open(state)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/sendstate.c"
                  ,0x47,"int quicly_sendstate_shutdown(quicly_sendstate_t *, uint64_t)");
  }
  if (in_RDI->size_inflight <= in_RSI) {
    if (((in_RDI->pending).num_ranges == 0) ||
       ((in_RDI->pending).ranges[(in_RDI->pending).num_ranges - 1].end != 0xffffffffffffffff)) {
      iVar1 = quicly_ranges_add((quicly_ranges_t *)
                                CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                (uint64_t)in_RDI,in_RSI);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    else {
      (in_RDI->pending).ranges[(in_RDI->pending).num_ranges - 1].end = in_RSI + 1;
    }
    in_RDI->final_size = in_RSI;
    return 0;
  }
  __assert_fail("state->size_inflight <= final_size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/sendstate.c"
                ,0x48,"int quicly_sendstate_shutdown(quicly_sendstate_t *, uint64_t)");
}

Assistant:

int quicly_sendstate_shutdown(quicly_sendstate_t *state, uint64_t final_size)
{
    int ret;

    assert(quicly_sendstate_is_open(state));
    assert(state->size_inflight <= final_size);

    if (state->pending.num_ranges != 0 && state->pending.ranges[state->pending.num_ranges - 1].end == UINT64_MAX) {
        state->pending.ranges[state->pending.num_ranges - 1].end = final_size + 1;
    } else {
        if ((ret = quicly_ranges_add(&state->pending, state->size_inflight, final_size + 1)) != 0)
            return ret;
    }

    state->final_size = final_size;
    return 0;
}